

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O1

int __thiscall VMState::PopJNZInstructionWithTarget(VMState *this,int address)

{
  pointer *ppiVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  int pos;
  
  piVar3 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)piVar3 - (long)piVar5;
  uVar7 = uVar6 >> 2;
  __n = (uVar6 & 0xfffffffc00000003) - 4;
  piVar5 = (pointer)((long)piVar5 + (uVar6 & 0x3fffffffc) + 4);
  do {
    piVar4 = piVar5;
    if ((int)uVar7 < 1) {
      return -1;
    }
    iVar2 = piVar4[-2];
    uVar7 = (ulong)((int)uVar7 - 1);
    piVar5 = piVar4 + -1;
    __n = __n + 4;
  } while ((this->m_Parent->m_Instructions).
           super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar2].field_0.arg1 + iVar2 + 1 != address);
  if (piVar5 != piVar3) {
    memmove(piVar4 + -2,piVar5,__n);
  }
  ppiVar1 = &(this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
  return iVar2;
}

Assistant:

int PopJNZInstructionWithTarget( int address )
	{
		// Find last JNZ instruction that points at specified address (we need last to find
		// outermost do..while block)

		for( int i = (int)m_JNZInstructions.size() - 1; i >= 0; --i)
			if ((m_JNZInstructions[i] + 1 + m_Parent.m_Instructions[m_JNZInstructions[i]].arg1) == address)
			{
				int pos = m_JNZInstructions[i];
				m_JNZInstructions.erase(m_JNZInstructions.begin() + i);
				return pos;
			}

		return -1;
	}